

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

bool __thiscall CKey::Load(CKey *this,CPrivKey *seckey,CPubKey *vchPubKey,bool fSkipCheck)

{
  long lVar1;
  uchar *seckey_00;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> t;
  bool bVar2;
  int iVar3;
  secure_unique_ptr<KeyType> *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MakeKeyData(this);
  seckey_00 = (seckey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
  iVar3 = ec_seckey_import_der
                    (secp256k1_context_sign,
                     ((this->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems,seckey_00,
                     (long)(seckey->
                           super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)seckey_00);
  if (iVar3 == 0) {
    this_00 = &this->keydata;
    t._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (array<unsigned_char,_32UL> *)0x0;
    if (t._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)this_00,t._M_head_impl);
    }
    bVar2 = false;
  }
  else {
    this->fCompressed = (vchPubKey->vch[0] & 0xfe) == 2;
    bVar2 = true;
    if (!fSkipCheck) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        bVar2 = VerifyPubKey(this,vchPubKey);
        return bVar2;
      }
      goto LAB_00d6c030;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
LAB_00d6c030:
  __stack_chk_fail();
}

Assistant:

bool CKey::Load(const CPrivKey &seckey, const CPubKey &vchPubKey, bool fSkipCheck=false) {
    MakeKeyData();
    if (!ec_seckey_import_der(secp256k1_context_sign, (unsigned char*)begin(), seckey.data(), seckey.size())) {
        ClearKeyData();
        return false;
    }
    fCompressed = vchPubKey.IsCompressed();

    if (fSkipCheck)
        return true;

    return VerifyPubKey(vchPubKey);
}